

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table.c
# Opt level: O0

int lyht_find_collision(hash_table *ht,ht_rec **last,ht_rec *first)

{
  uint uVar1;
  uint32_t uVar2;
  ht_rec *phVar3;
  bool bVar4;
  uint local_34;
  uint32_t idx;
  uint32_t i;
  ht_rec *inval_rec;
  ht_rec *first_local;
  ht_rec **last_local;
  hash_table *ht_local;
  
  _idx = (ht_rec *)0x0;
  if ((last != (ht_rec **)0x0) && (*last != (ht_rec *)0x0)) {
    uVar1 = (*last)->hash;
    uVar2 = ht->size;
    local_34 = (uint)(((long)*last - (long)ht->recs) / (long)(ulong)ht->rec_size);
    do {
      local_34 = (local_34 + 1) % ht->size;
      phVar3 = lyht_get_rec(ht->recs,ht->rec_size,local_34);
      *last = phVar3;
      if (*last == first) {
        if (_idx != (ht_rec *)0x0) {
          *last = _idx;
          return 1;
        }
        __assert_fail("inval_rec",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/hash_table.c"
                      ,0x1dc,
                      "int lyht_find_collision(struct hash_table *, struct ht_rec **, struct ht_rec *)"
                     );
      }
      if (((*last)->hits == -1) && (_idx == (ht_rec *)0x0)) {
        _idx = *last;
      }
      bVar4 = false;
      if (((*last)->hits != 0) && (bVar4 = true, (*last)->hits != -1)) {
        bVar4 = ((*last)->hash & ht->size - 1) != (uVar1 & uVar2 - 1);
      }
    } while (bVar4);
    if ((*last)->hits < 1) {
      if (_idx != (ht_rec *)0x0) {
        *last = _idx;
      }
      ht_local._4_4_ = 1;
    }
    else {
      if ((*last)->hits != 1) {
        __assert_fail("(*last)->hits == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/hash_table.c"
                      ,0x1e8,
                      "int lyht_find_collision(struct hash_table *, struct ht_rec **, struct ht_rec *)"
                     );
      }
      if (_idx != (ht_rec *)0x0) {
        memcpy(_idx,*last,(ulong)ht->rec_size);
        (*last)->hits = -1;
        *last = _idx;
      }
      ht_local._4_4_ = 0;
    }
    return ht_local._4_4_;
  }
  __assert_fail("last && *last",
                "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/hash_table.c"
                ,0x1d1,
                "int lyht_find_collision(struct hash_table *, struct ht_rec **, struct ht_rec *)");
}

Assistant:

static int
lyht_find_collision(struct hash_table *ht, struct ht_rec **last, struct ht_rec *first)
{
    struct ht_rec *inval_rec = NULL;
    uint32_t i, idx;

    assert(last && *last);

    idx = (*last)->hash & (ht->size - 1);
    i = (((unsigned char *)*last) - ht->recs) / ht->rec_size;

    do {
        i = (i + 1) % ht->size;
        *last = lyht_get_rec(ht->recs, ht->rec_size, i);
        if (*last == first) {
            /* we went through all the records (very unlikely, but possible when many records are invalid),
             * just return an invalid record */
            assert(inval_rec);
            *last = inval_rec;
            return 1;
        }

        if (((*last)->hits == -1) && !inval_rec) {
            inval_rec = *last;
        }
    } while (((*last)->hits != 0) && (((*last)->hits == -1) || (((*last)->hash & (ht->size - 1)) != idx)));

    if ((*last)->hits > 0) {
        /* we found a collision, so move it to the first invalid record so the next search is faster */
        assert((*last)->hits == 1);
        if (inval_rec) {
            memcpy(inval_rec, *last, ht->rec_size);
            (*last)->hits = -1;
            *last = inval_rec;
        }
        return 0;
    }

    /* no next collision found, return the record where it would be inserted */
    if (inval_rec) {
        *last = inval_rec;
    } /* else (*last)->hits == 0, it is already correct */
    return 1;
}